

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

void GetFileAndPassword(char *nextarg,char **file,char **password)

{
  char *local_30;
  char *passphrase;
  char *certname;
  char **password_local;
  char **file_local;
  char *nextarg_local;
  
  certname = (char *)password;
  password_local = file;
  file_local = (char **)nextarg;
  parse_cert_parameter(nextarg,&passphrase,&local_30);
  free(*password_local);
  *password_local = (char *)0x0;
  *password_local = passphrase;
  if (local_30 != (char *)0x0) {
    free(*(void **)certname);
    certname[0] = '\0';
    certname[1] = '\0';
    certname[2] = '\0';
    certname[3] = '\0';
    certname[4] = '\0';
    certname[5] = '\0';
    certname[6] = '\0';
    certname[7] = '\0';
    *(char **)certname = local_30;
  }
  cleanarg((char *)file_local);
  return;
}

Assistant:

static void
GetFileAndPassword(char *nextarg, char **file, char **password)
{
  char *certname, *passphrase;
  parse_cert_parameter(nextarg, &certname, &passphrase);
  Curl_safefree(*file);
  *file = certname;
  if(passphrase) {
    Curl_safefree(*password);
    *password = passphrase;
  }
  cleanarg(nextarg);
}